

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

double __thiscall despot::Logger::AverageDiscountedRoundReward(Logger *this)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  
  pdVar1 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pdVar2 - (long)pdVar1 >> 3;
  dVar7 = 0.0;
  dVar6 = 0.0;
  if (pdVar2 != pdVar1) {
    lVar4 = 0;
    do {
      dVar6 = dVar6 + pdVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  if (pdVar2 != pdVar1) {
    auVar5._8_4_ = (int)((long)pdVar2 - (long)pdVar1 >> 0x23);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    dVar7 = dVar6 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  }
  return dVar7;
}

Assistant:

double Logger::AverageDiscountedRoundReward() const {
	double sum = 0;
	for (int i = 0; i < discounted_round_rewards_.size(); i++) {
		double reward = discounted_round_rewards_[i];
		sum += reward;
	}
	return discounted_round_rewards_.size() > 0 ?
			(sum / discounted_round_rewards_.size()) : 0.0;
}